

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

int HTS_fseek(HTS_File *fp,long offset,int origin)

{
  long lVar1;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  HTS_Data *d;
  int local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 1;
  }
  else if (*in_RDI == '\0') {
    local_4 = fseek(*(FILE **)(in_RDI + 8),in_RSI,in_EDX);
  }
  else if (*in_RDI == '\x01') {
    lVar1 = *(long *)(in_RDI + 8);
    if (in_EDX == 0) {
      *(long *)(lVar1 + 0x10) = in_RSI;
    }
    else if (in_EDX == 1) {
      *(long *)(lVar1 + 0x10) = in_RSI + *(long *)(lVar1 + 0x10);
    }
    else {
      if (in_EDX != 2) {
        return 1;
      }
      *(long *)(lVar1 + 0x10) = *(long *)(lVar1 + 8) + in_RSI;
    }
    local_4 = 0;
  }
  else {
    HTS_error(0,"HTS_fseek: Unknown file type.\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int HTS_fseek(HTS_File * fp, long offset, int origin)
{
   if (fp == NULL) {
      return 1;
   } else if (fp->type == HTS_FILE) {
      return fseek((FILE *) fp->pointer, offset, origin);
   } else if (fp->type == HTS_DATA) {
      HTS_Data *d = (HTS_Data *) fp->pointer;
      if (origin == SEEK_SET) {
         d->index = (size_t) offset;
      } else if (origin == SEEK_CUR) {
         d->index += offset;
      } else if (origin == SEEK_END) {
         d->index = d->size + offset;
      } else {
         return 1;
      }
      return 0;
   }
   HTS_error(0, "HTS_fseek: Unknown file type.\n");
   return 1;
}